

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fancy_tools.cxx
# Opt level: O2

void __thiscall fancy_tools::process(fancy_tools *this,cl_parser *cl)

{
  bool bVar1;
  xr_ini_file *this_00;
  xr_file_system *this_01;
  char *pcVar2;
  size_t lindex;
  allocator<char> local_89;
  char *level;
  char *profile;
  char *fancy_config;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = check_paths(this);
  if (bVar1) {
    bVar1 = cl_parser::get_string(cl,"-fancy",&fancy_config);
    if (bVar1) {
      this_00 = (xr_ini_file *)operator_new(0x18);
      xray_re::xr_ini_file::xr_ini_file(this_00,fancy_config);
      this->m_ini = this_00;
      if ((this_00->m_sections).
          super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this_00->m_sections).
          super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        xray_re::msg("can\'t load %s",fancy_config);
      }
      else {
        this_01 = xray_re::xr_file_system::instance();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&path,"gamedata.fancy\\",(allocator<char> *)&local_50);
        bVar1 = cl_parser::get_string(cl,"-dir",&path);
        if (bVar1) {
          xray_re::xr_file_system::append_path_separator(&path);
        }
        std::__cxx11::string::append((char *)&path);
        bVar1 = xray_re::xr_file_system::create_path(this_01,path._M_dataplus._M_p);
        if (bVar1) {
          lindex = 0;
          while( true ) {
            bVar1 = xray_re::xr_ini_file::r_line(this->m_ini,"levels",lindex,&level,&profile);
            if (!bVar1) break;
            bVar1 = xray_re::xr_file_system::folder_exist(this_01,"$game_levels$",level);
            if (bVar1) {
              std::operator+(&local_50,&path,level);
              bVar1 = xray_re::xr_file_system::create_folder(this_01,local_50._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_50);
              if (!bVar1) {
                pcVar2 = "can\'t create output folder for %s";
                goto LAB_00120d97;
              }
              xray_re::xr_file_system::update_path(this_01,"$level$","$game_levels$",level);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,level,&local_89);
              xray_re::xr_file_system::update_path
                        (this_01,"$fancy_level$",path._M_dataplus._M_p,local_50._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_50);
              xray_re::msg("processing %s",level);
              bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,profile,"fix_details");
              if (bVar1) {
                pcVar2 = xray_re::xr_ini_file::r_string(this->m_ini,profile,"fix_details");
                fix_details(this,pcVar2);
              }
              bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,profile,"fix_fences");
              if (bVar1) {
                pcVar2 = xray_re::xr_ini_file::r_string(this->m_ini,profile,"fix_fences");
                fix_fences(this,pcVar2);
              }
            }
            else {
              pcVar2 = "can\'t find level %s";
LAB_00120d97:
              xray_re::msg(pcVar2,level);
            }
            lindex = lindex + 1;
          }
        }
        else {
          xray_re::msg("can\'t create output folder %s",path._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&path);
      }
    }
  }
  return;
}

Assistant:

void fancy_tools::process(const cl_parser& cl)
{
	if (!check_paths())
		return;

	const char* fancy_config;
	if (!cl.get_string("-fancy", fancy_config))
		return;
	m_ini = new xr_ini_file(fancy_config);
	if (m_ini->empty()) {
		msg("can't load %s", fancy_config);
		return;
	}

	xr_file_system& fs = xr_file_system::instance();

	std::string path("gamedata.fancy\\");
	if (cl.get_string("-dir", path))
		fs.append_path_separator(path);
	path.append("levels\\");
	if (!fs.create_path(path)) {
		msg("can't create output folder %s", path.c_str());
		return;
	}

	const char* level;
	const char* profile;
	for (size_t i = 0; m_ini->r_line("levels", i, &level, &profile); ++i) {
		if (!fs.folder_exist(PA_GAME_LEVELS, level)) {
			msg("can't find level %s", level);
			continue;
		}
		if (!fs.create_folder(path + level)) {
			msg("can't create output folder for %s", level);
			continue;
		}
		fs.update_path(PA_LEVEL, PA_GAME_LEVELS, level);
		fs.update_path(PA_FANCY_LEVEL, path, level);
		msg("processing %s", level);
		if (m_ini->line_exist(profile, "fix_details"))
			fix_details(m_ini->r_string(profile, "fix_details"));
		if (m_ini->line_exist(profile, "fix_fences"))
			fix_fences(m_ini->r_string(profile, "fix_fences"));
	}
}